

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O0

bool __thiscall mpt::buffer::skip(buffer *this,size_t len)

{
  ulong uVar1;
  _func_void_void_ptr *p_Var2;
  size_t __n;
  buffer *__dest;
  type_traits *ptVar3;
  ulong local_50;
  size_t i;
  _func_void_void_ptr *fini;
  size_t size;
  type_traits *traits;
  uint8_t *base;
  size_t post;
  size_t len_local;
  buffer *this_local;
  
  if (this->_used < len) {
    this_local._7_1_ = false;
  }
  else {
    __n = this->_used - len;
    __dest = this + 1;
    ptVar3 = content_traits(this);
    if (ptVar3 != (type_traits *)0x0) {
      uVar1 = ptVar3->size;
      if ((uVar1 == 0) || (len % uVar1 != 0)) {
        return false;
      }
      p_Var2 = ptVar3->fini;
      if (p_Var2 != (_func_void_void_ptr *)0x0) {
        for (local_50 = 0; local_50 < len; local_50 = uVar1 + local_50) {
          (*p_Var2)((void *)((long)&__dest->_vptr_buffer + local_50));
        }
      }
    }
    memmove(__dest,(void *)((long)&__dest->_vptr_buffer + len),__n);
    this->_used = __n;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool buffer::skip(size_t len)
{
	if (_used < len) {
		return false;
	}
	size_t post = _used - len;
	uint8_t *base = static_cast<uint8_t *>(static_cast<void *>(this + 1));
	const struct type_traits *traits;
	if ((traits = content_traits())) {
		size_t size;
		if (!(size = traits->size)
		 || len % size) {
			return false;
		}
		void (*fini)(void *);
		if ((fini = traits->fini)) {
			for (size_t i = 0; i < len; i += size) {
				fini(base + i);
			}
		}
	}
	std::memmove(base, base + len, post);
	_used = post;
	return true;
}